

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_annotate.cpp
# Opt level: O2

void snestistics::guess_range
               (Trace *trace,RomAccessor *rom,AnnotationResolver *annotations,string *output_file)

{
  pointer pFVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_color p;
  _Rb_tree_color p_00;
  pointer pAVar3;
  pointer pFVar4;
  byte opcode;
  bool bVar5;
  Pointer PVar6;
  int iVar7;
  uint uVar8;
  Hint *pHVar9;
  _Rb_tree_node_base *p_Var10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar15;
  ulong uVar16;
  uint32_t j;
  ulong uVar17;
  pointer pAVar18;
  _Rb_tree_header *p_Var19;
  char cVar20;
  uint local_134;
  Pointer jump_target;
  Pointer *local_120;
  AnnotationResolver *local_118;
  _Rb_tree_node_base *local_110;
  uint local_104;
  ulong local_100;
  size_type_conflict local_f8;
  Pointer jump_secondary_target;
  FILE *local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> merged_with;
  vector<FoundRange,_std::allocator<FoundRange>_> found_ranges;
  FoundRange found;
  uint local_38;
  uint local_34;
  ulong uVar14;
  
  local_118 = annotations;
  local_e8 = fopen((output_file->_M_dataplus)._M_p,"wt");
  found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var10 = (trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(trace->ops)._M_t._M_impl.super__Rb_tree_header;
  do {
    pFVar4 = found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((_Rb_tree_header *)p_Var10 == p_Var19) {
      local_f8 = (long)found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)found_ranges.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6;
      found.start = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&merged_with,local_f8,&found.start,(allocator_type *)&jump_target);
      local_104 = 1;
      iVar7 = 0;
      local_134 = -1;
      for (uVar17 = 0; uVar14 = uVar17, uVar17 < local_f8; uVar17 = (ulong)((uint)uVar17 + 1)) {
        do {
          uVar16 = uVar14;
          uVar14 = (ulong)merged_with.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar16];
        } while (merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar16] != 0xffffffff);
        pFVar1 = pFVar4 + uVar17;
        local_110 = &pFVar4[uVar17].branches_out._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = pFVar4[uVar17].branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_120 = &pFVar4[uVar16].stop;
        local_100 = CONCAT44(local_100._4_4_,-iVar7);
        for (; p_Var10 != local_110;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          _Var2 = p_Var10[1]._M_color;
          if ((_Var2 < pFVar1->start) || (pFVar1->stop < _Var2)) {
            found.start = 0;
            found.stop = 0;
            AnnotationResolver::resolve_annotation
                      (local_118,_Var2,(Annotation **)&found,(Annotation **)0x0);
            if (found._0_8_ == 0) {
              p = pFVar1->start;
              p_00 = pFVar1->stop;
              iVar12 = p - _Var2;
              if (p < _Var2 || p - _Var2 == 0) {
                iVar12 = _Var2 - p_00;
              }
              if (1000 < iVar12) {
                pFVar1->num_long_jumps = pFVar1->num_long_jumps + 1;
              }
              if (_Var2 < p) {
                PVar6 = AnnotationResolver::find_last_free_before_or_at(local_118,p,_Var2);
                if (PVar6 != 0xffffffff) {
                  iVar12 = 0;
                  do {
                    iVar11 = iVar12;
                    if ((int)(local_134 + iVar11) < 0) break;
                    iVar12 = iVar11 + -1;
                  } while (PVar6 <= pFVar4[local_134 + iVar11].stop);
                  if (iVar11 != 0) {
                    uVar13 = iVar11 + (int)local_100;
                    do {
                      uVar8 = uVar13;
                      uVar13 = merged_with.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[(int)uVar8];
                      uVar15 = uVar8;
                    } while (merged_with.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(int)uVar8] != 0xffffffff);
                    while (uVar15 = uVar15 + 1, uVar15 <= (uint)uVar17) {
                      if (pFVar4[uVar15].valid == true) {
                        pFVar4[uVar15].valid = false;
                        merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar15] = uVar8;
                      }
                    }
                    pFVar4[(int)uVar8].stop = pFVar1->stop;
                  }
                }
              }
              else if ((p_00 < _Var2) &&
                      (PVar6 = AnnotationResolver::find_last_free_after_or_at(local_118,p_00,_Var2),
                      uVar13 = local_104, PVar6 != 0xffffffff)) {
                while ((uVar14 = (ulong)uVar13, uVar14 < local_f8 && (pFVar4[uVar14].start <= PVar6)
                       )) {
                  if (pFVar4[uVar14].valid != false) {
                    if (*local_120 < pFVar4[uVar14].stop) {
                      *local_120 = pFVar4[uVar14].stop;
                    }
                    pFVar4[uVar14].valid = false;
                    merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14] = (uint)uVar16;
                  }
                  uVar13 = uVar13 + 1;
                }
              }
            }
          }
        }
        local_104 = local_104 + 1;
        iVar7 = iVar7 + -1;
        local_134 = local_134 + 1;
      }
      local_120 = (Pointer *)((ulong)local_120 & 0xffffffff00000000);
      local_134 = 0xffffffff;
      local_110 = (_Rb_tree_node_base *)CONCAT44(local_110._4_4_,0xffffffff);
      uVar13 = 0;
      uVar15 = 0;
      local_100 = 0;
      do {
        uVar17 = (ulong)uVar15;
        if (local_f8 <= uVar17) {
          printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n",
                 (ulong)local_120 & 0xffffffff,(ulong)local_110 & 0xffffffff,(ulong)uVar13,
                 (ulong)local_134);
          fclose(local_e8);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::vector<FoundRange,_std::allocator<FoundRange>_>::~vector(&found_ranges);
          return;
        }
        pFVar1 = pFVar4 + uVar17;
        if (4 < pFVar4[uVar17].num_long_jumps) {
          printf("Long jumps to %06X-%06X (%d)\n",(ulong)pFVar1->start,(ulong)pFVar1->stop);
        }
        if (pFVar1->valid == true) {
          pAVar3 = (local_118->_annotations).
                   super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pAVar18 = (local_118->_annotations).
                         super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                         ._M_impl.super__Vector_impl_data._M_start; pAVar18 != pAVar3;
              pAVar18 = pAVar18 + 1) {
            Annotation::Annotation((Annotation *)&found,pAVar18);
            if (((found.start == 1) && (local_38 <= pFVar1->stop)) && (pFVar1->stop <= local_34)) {
              Annotation::~Annotation((Annotation *)&found);
              puts("Collision!");
              goto LAB_00143bec;
            }
            Annotation::~Annotation((Annotation *)&found);
          }
          uVar8 = pFVar1->stop - pFVar1->start;
          iVar7 = (int)local_110;
          if (uVar13 < uVar8) {
            iVar7 = (int)local_120;
          }
          local_110 = (_Rb_tree_node_base *)CONCAT44(local_110._4_4_,iVar7);
          if (uVar13 < uVar8) {
            local_134 = uVar15;
          }
          if (uVar13 < uVar8) {
            uVar13 = uVar8 + 1;
          }
          local_120 = (Pointer *)CONCAT44(local_120._4_4_,(int)local_120 + 1);
          iVar7 = (int)local_100;
          fprintf(local_e8,"function %06X %06X Auto%04d\n");
          local_100 = (ulong)(iVar7 + 1);
        }
LAB_00143bec:
        uVar15 = uVar15 + 1;
      } while( true );
    }
    found.start = 0xffffffff;
    found.stop = 0xffffffff;
    found.valid = true;
    found.num_long_jumps = 0;
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header;
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         found.branches_out._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; (_Rb_tree_header *)p_Var10 != p_Var19;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      _Var2 = p_Var10[1]._M_color;
      merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AnnotationResolver::resolve_annotation
                (local_118,_Var2,(Annotation **)&merged_with,(Annotation **)0x0);
      if (merged_with.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) break;
      opcode = RomAccessor::evalByte(rom,_Var2);
      if (found.start == 0xffffffff) {
        found.start = _Var2;
      }
      if ((&jump_or_branch)[opcode] == '\x01') {
        pHVar9 = AnnotationResolver::hint(local_118,_Var2);
        if ((pHVar9 == (Hint *)0x0) || (cVar20 = '\x01', (pHVar9->hints & 0x20) == 0)) {
          cVar20 = (&branches8)[opcode];
        }
        bVar5 = decode_static_jump(opcode,rom,_Var2,&jump_target,&jump_secondary_target);
        if ((cVar20 != '\0') &&
           (((jump_target ^ _Var2) < 0x10000 && jump_target != 0xffffffff) && bVar5)) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&found.branches_out,&jump_target);
        }
        if (bVar5 && jump_secondary_target == 0xffffffff) {
          found.stop = _Var2;
          std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back(&found_ranges,&found);
          break;
        }
      }
      else if ((opcode - 0x40 < 0x2c) &&
              ((0x80100000001U >> ((ulong)(opcode - 0x40) & 0x3f) & 1) != 0)) {
        found.stop = _Var2;
        std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back(&found_ranges,&found);
        break;
      }
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&found.branches_out._M_t);
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void guess_range(const Trace &trace, const RomAccessor &rom, const AnnotationResolver &annotations, std::string &output_file) {

	FILE *output = fopen(output_file.c_str(), "wt");

	int unknownCounter = 0;

	struct FoundRange {
		Pointer start = INVALID_POINTER, stop = INVALID_POINTER;
		bool valid = true;

		bool inside(Pointer p) const { return p >= start && p <= stop; }

		int num_long_jumps = 0;

		std::set<Pointer> branches_out;
	};

	// TODO: Support trace annotation jump is jsr
	std::vector<FoundRange> found_ranges;

	for (auto it = trace.ops.begin(); it != trace.ops.end(); ++it) {
		FoundRange found;
		while (it != trace.ops.end()) {
			Pointer pc = it->first;

			const Annotation *function = nullptr;
			annotations.resolve_annotation(pc, &function);

			// We only want unknown but executed stuff!
			if (function)
				break;

			uint8_t opcode = rom.evalByte(pc);

			if (found.start == INVALID_POINTER)
				found.start = pc;

			if (jump_or_branch[opcode]) {
				const Hint *hint = annotations.hint(pc);
				bool merge_long_jumps = hint && hint->has_hint(Hint::ANNOTATE_MERGE);
				bool relevant_jump = merge_long_jumps || branches8[opcode];

				Pointer jump_target, jump_secondary_target;
				bool op_is_jump_or_branch = decode_static_jump(opcode, rom, pc, &jump_target, &jump_secondary_target);

				bool jump_is_jsr = false;
				if (hint && hint->has_hint(Hint::JUMP_IS_JSR))
					jump_is_jsr = true;

				if (relevant_jump && op_is_jump_or_branch && jump_target != INVALID_POINTER && same_bank(pc, jump_target)) {
					found.branches_out.insert(jump_target);
				}

				// Stop if we find a branch or a jump
				if (op_is_jump_or_branch && jump_secondary_target == INVALID_POINTER) {
					// If there is a secondary jump target (as in a branch) we don't need to stop
					found.stop = pc;
					found_ranges.push_back(found);
					break;
				}
			} else if (opcode == 0x40 || opcode == 0x6B || opcode == 0x60) {
				// Some sort of return (RTS, RTI, RTL)
				found.stop = pc;
				found_ranges.push_back(found);
				break;
			}
			it++;
		}
	}

	std::vector<uint32_t> merged_with(found_ranges.size(), -1);

	for (uint32_t j = 0; j <= found_ranges.size(); ++j) { // TODO: Make <= be just <

		bool debug = false;

		if (debug) {
			printf("Step %d\n", j);

			for (uint32_t ai = 0; ai < found_ranges.size(); ai++) {
				const FoundRange &f = found_ranges[ai];
				printf(" %d: %06X-%06X%s", ai, f.start, f.stop, f.valid ? "" : " (invalid)");
				if (merged_with[ai] != -1)
					printf(" (merged with %d)", merged_with[ai]);
				printf("\n");

				if (ai >= j)
					for (auto b : f.branches_out) {
						if (f.inside(b))
							continue;
						printf("   -> %06X", b);
						for (uint32_t bi = 0; bi < found_ranges.size(); ++bi) {
							const FoundRange &fb = found_ranges[bi];
							if (fb.start <= b && b <= fb.stop)
								printf(" %d", bi);
						}
						printf("\n");
					}
			}
		}

		// We went one extra round for debugging!
		if (j == found_ranges.size())
			break;

		uint32_t merge_target = j;
		while (merged_with[merge_target] != -1)
			merge_target = merged_with[merge_target];

		auto &branches_out = found_ranges[j].branches_out;

		FoundRange &fj = found_ranges[j];

		//printf("Doing %d, saving into %d\n", j, merge_target);
		for (Pointer target : branches_out) {
			// We have three cases; forward, backward or internal branches. We treat them separately for clarity
			if (fj.inside(target)) // Ignore internal branches/jumps
				continue;

			// TODO: This is not enough.. We must stop at any function in the range...
			//       Basically cut target at any function def...
			const Annotation *target_function = nullptr;
			annotations.resolve_annotation(target, &target_function);
			if (target_function)
				continue;

			int len = 0;
			if (target < fj.start) {
				len = fj.start - target;
			}
			else {
				len = target - fj.stop;
			}
			if (len > 1000) {
				fj.num_long_jumps++;
			}

			Pointer t1 = target;

			if (target < fj.start) {
				target = annotations.find_last_free_before_or_at(fj.start, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;
				// Branch going out to smaller addresses (before j)

				int lowest_merge = j;

				for (int32_t t = j - 1; t >= 0; --t) {
					FoundRange &merger = found_ranges[t];
					if (target > merger.stop) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					lowest_merge = t;
				}

				if (lowest_merge == j)
					continue;

				while (merged_with[lowest_merge] != -1)
					lowest_merge = merged_with[lowest_merge];

				// We want to merge the range (lowest_range, ..., j) into lowest_range
				for (uint32_t t = lowest_merge + 1; t <= j; t++) {
					FoundRange &f = found_ranges[t];
					if (f.valid) {
						f.valid = false;
						merged_with[t] = lowest_merge;
					}
				}

				found_ranges[lowest_merge].stop = fj.stop;

			} else if (target > fj.stop) {

				target = annotations.find_last_free_after_or_at(fj.stop, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;

				// Branch going out to larger addresses (after j)
				for (uint32_t t = j + 1; t<found_ranges.size(); ++t) {
					FoundRange &merger = found_ranges[t];
					if (target < merger.start) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					if (merger.valid) {
						// Merge t into j (the easy case)
						if (merger.stop > found_ranges[merge_target].stop)
							found_ranges[merge_target].stop = merger.stop;
						merger.valid = false; // Since we make it invalid it can only be merged once...
						merged_with[t] = merge_target;
					}
				}
			}
		}
	}

	int num_found = 0;

	int longest = -1, longest_range = -1;
	uint32_t longest_length = 0;

	for (uint32_t fi = 0; fi < found_ranges.size(); ++fi) {
		const FoundRange &f = found_ranges[fi];
		if (f.num_long_jumps > 4) {
			printf("Long jumps to %06X-%06X (%d)\n", f.start, f.stop, f.num_long_jumps);
		}

		if (f.valid) {
			bool collision = false;
			for (auto k : annotations._annotations) {
				if (k.type == AnnotationType::ANNOTATION_FUNCTION) {
					if (f.stop < k.startOfRange || f.stop > k.endOfRange) {
						continue;
					}
					else {
						collision = true;
						break;
					}
				}
			}
			if (collision) {
				printf("Collision!\n");
			}
			else {
				// TODO: Validate that there is no function annotation inside a range
				if (f.stop - f.start > longest_length) {
					longest = num_found;
					longest_length = f.stop - f.start + 1;
					longest_range = fi;
				}
				num_found++;
				fprintf(output, "function %06X %06X Auto%04d\n", f.start, f.stop, unknownCounter++);
			}
		}
	}

	printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n", num_found, longest, longest_length, longest_range);

	fclose(output);
}